

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

void __thiscall Darts::Details::DoubleArrayBuilder::expand_units(DoubleArrayBuilder *this)

{
  AutoPool<Darts::Details::DoubleArrayBuilderUnit> *this_00;
  uint uVar1;
  ulong uVar2;
  id_type iVar3;
  DoubleArrayBuilderExtraUnit *pDVar4;
  DoubleArrayBuilderExtraUnit *pDVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  bool *pbVar10;
  byte bVar11;
  ulong uVar12;
  ulong size;
  
  this_00 = &this->units_;
  uVar2 = (this->units_).size_;
  iVar3 = (id_type)uVar2;
  uVar7 = iVar3 + 0x100;
  uVar1 = (uint)(uVar2 >> 8);
  if (uVar1 - 0x10 < 0xffffffef) {
    uVar12 = (ulong)((uVar1 - 0x10) * 0x100);
    pDVar5 = (this->extras_).array_;
    pbVar10 = &pDVar5->is_used_ + (uVar1 & 0xf) * 0xc00;
    iVar6 = 0;
    do {
      if (*pbVar10 != true) {
        bVar11 = -(char)iVar6;
        goto LAB_001f098f;
      }
      iVar6 = iVar6 + -1;
      pbVar10 = pbVar10 + 0xc;
    } while (iVar6 != -0x100);
    bVar11 = 0;
LAB_001f098f:
    lVar8 = (ulong)((uVar1 & 0xf) << 8) * 3 + 2;
    iVar6 = 0x100;
    do {
      if ((char)(&pDVar5->prev_)[lVar8] == '\0') {
        if ((this->units_).size_ <= uVar12) {
          expand_units(this);
          pDVar5 = (this->extras_).array_;
        }
        uVar1 = *(uint *)((long)pDVar5 + lVar8 * 4 + -4);
        if ((uVar12 == this->extras_head_) && (this->extras_head_ = uVar1, uVar12 == uVar1)) {
          this->extras_head_ = (id_type)(this->units_).size_;
        }
        uVar9 = *(uint *)((long)pDVar5 + lVar8 * 4 + -8);
        pDVar5[(ulong)uVar9 & 0xfff].next_ = uVar1;
        pDVar5[(ulong)*(uint *)((long)pDVar5 + lVar8 * 4 + -4) & 0xfff].prev_ = uVar9;
        *(undefined1 *)(&pDVar5->prev_ + lVar8) = 1;
        (this_00->buf_).array_[uVar12 * 4] = bVar11 ^ (byte)uVar12;
      }
      uVar12 = uVar12 + 1;
      lVar8 = lVar8 + 3;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    size = (ulong)uVar7;
    AutoPool<Darts::Details::DoubleArrayBuilderUnit>::resize(this_00,size);
    uVar12 = uVar2 & 0xffffffff;
    if (uVar12 < size) {
      pDVar5 = (this->extras_).array_;
      do {
        pDVar4 = pDVar5 + ((uint)uVar12 & 0xfff);
        pDVar4->is_fixed_ = false;
        pDVar4->is_used_ = false;
        uVar12 = uVar12 + 1;
      } while (size != uVar12);
    }
  }
  else {
    AutoPool<Darts::Details::DoubleArrayBuilderUnit>::resize(this_00,(ulong)uVar7);
  }
  pDVar5 = (this->extras_).array_;
  if (iVar3 + 1 < uVar7) {
    iVar6 = 0xff;
    uVar12 = uVar2 & 0xffffffff;
    do {
      uVar1 = (uint)uVar12;
      uVar7 = uVar1 + 1;
      pDVar5[uVar1 & 0xfff].next_ = uVar7;
      pDVar5[uVar7 & 0xfff].prev_ = uVar1;
      uVar12 = (ulong)uVar7;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  uVar9 = iVar3 + 0xff;
  pDVar5[uVar2 & 0xfff].prev_ = uVar9;
  uVar1 = this->extras_head_;
  uVar12 = (ulong)uVar1 & 0xfff;
  uVar7 = pDVar5[uVar12].prev_;
  pDVar5[uVar2 & 0xfff].prev_ = uVar7;
  pDVar5[uVar9 & 0xfff].next_ = uVar1;
  pDVar5[(ulong)uVar7 & 0xfff].next_ = iVar3;
  pDVar5[uVar12].prev_ = uVar9;
  return;
}

Assistant:

inline void DoubleArrayBuilder::expand_units() {
  id_type src_num_units = units_.size();
  id_type src_num_blocks = num_blocks();

  id_type dest_num_units = src_num_units + BLOCK_SIZE;
  id_type dest_num_blocks = src_num_blocks + 1;

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    fix_block(src_num_blocks - NUM_EXTRA_BLOCKS);
  }

  units_.resize(dest_num_units);

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    for (std::size_t id = src_num_units; id < dest_num_units; ++id) {
      extras(id).set_is_used(false);
      extras(id).set_is_fixed(false);
    }
  }

  for (id_type i = src_num_units + 1; i < dest_num_units; ++i) {
    extras(i - 1).set_next(i);
    extras(i).set_prev(i - 1);
  }

  extras(src_num_units).set_prev(dest_num_units - 1);
  extras(dest_num_units - 1).set_next(src_num_units);

  extras(src_num_units).set_prev(extras(extras_head_).prev());
  extras(dest_num_units - 1).set_next(extras_head_);

  extras(extras(extras_head_).prev()).set_next(src_num_units);
  extras(extras_head_).set_prev(dest_num_units - 1);
}